

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O1

void __thiscall btSliderConstraint::getInfo1(btSliderConstraint *this,btConstraintInfo1 *info)

{
  int iVar1;
  btConstraintInfo1 bVar2;
  
  if (this->m_useSolveConstraintObsolete == true) {
    info->m_numConstraintRows = 0;
    iVar1 = 0;
  }
  else {
    info->m_numConstraintRows = 4;
    info->nub = 2;
    calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                              m_worldTransform,
                        &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                         m_worldTransform);
    testAngLimits(this);
    testLinLimits(this);
    if ((this->m_solveLinLim != false) || (this->m_poweredLinMotor == true)) {
      bVar2.m_numConstraintRows = (*info).m_numConstraintRows + 1;
      bVar2.nub = (*info).nub + -1;
      *info = bVar2;
    }
    if ((this->m_solveAngLim == false) && (this->m_poweredAngMotor != true)) {
      return;
    }
    info->m_numConstraintRows = info->m_numConstraintRows + 1;
    iVar1 = info->nub + -1;
  }
  info->nub = iVar1;
  return;
}

Assistant:

void btSliderConstraint::getInfo1(btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	}
	else
	{
		info->m_numConstraintRows = 4; // Fixed 2 linear + 2 angular
		info->nub = 2; 
		//prepare constraint
		calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
		testAngLimits();
		testLinLimits();
		if(getSolveLinLimit() || getPoweredLinMotor())
		{
			info->m_numConstraintRows++; // limit 3rd linear as well
			info->nub--; 
		}
		if(getSolveAngLimit() || getPoweredAngMotor())
		{
			info->m_numConstraintRows++; // limit 3rd angular as well
			info->nub--; 
		}
	}
}